

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_SubDDisplayParameters::Read(ON_SubDDisplayParameters *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_SubDComponentLocation OVar2;
  bool local_33;
  bool local_32;
  ON_SubDComponentLocation local_31;
  uint local_30;
  bool bComputeCurvature;
  bool bDisplayDensityIsAbsolute;
  uint uStack_2c;
  ON_SubDComponentLocation loc;
  uint loc_as_unsigned;
  uint display_density;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int chunk_version;
  ON_BinaryArchive *archive_local;
  ON_SubDDisplayParameters *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  memcpy(this,&Default,0x40);
  display_density = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(pOStack_20,(int *)&display_density);
  if (!bVar1) {
    return false;
  }
  loc_as_unsigned._3_1_ = 0;
  if (0 < (int)display_density) {
    uStack_2c = DisplayDensity(this,&ON_SubD::Empty);
    bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&stack0xffffffffffffffd4);
    if (bVar1) {
      SetAdaptiveDisplayDensity(this,uStack_2c);
      OVar2 = MeshLocation(this);
      local_30 = (uint)OVar2;
      bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_30);
      if (bVar1) {
        local_31 = ON_SubDComponentLocationFromUnsigned(local_30);
        SetMeshLocation(this,local_31);
        if (1 < (int)display_density) {
          local_32 = false;
          bVar1 = ON_BinaryArchive::ReadBool(pOStack_20,&local_32);
          if (!bVar1) goto LAB_0071b9a1;
          if ((local_32 & 1U) != 0) {
            SetAbsoluteDisplayDensity(this,uStack_2c);
          }
          if (2 < (int)display_density) {
            local_33 = false;
            bVar1 = ON_BinaryArchive::ReadBool(pOStack_20,&local_33);
            if (!bVar1) goto LAB_0071b9a1;
            SetComputeCurvature(this,(bool)(local_33 & 1));
          }
        }
        loc_as_unsigned._3_1_ = 1;
      }
    }
  }
LAB_0071b9a1:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
  if (!bVar1) {
    loc_as_unsigned._3_1_ = 0;
  }
  return (bool)(loc_as_unsigned._3_1_ & 1);
}

Assistant:

bool ON_SubDDisplayParameters::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDDisplayParameters::Default;
  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;
  bool rc = false;
  for (;;)
  {
    if (chunk_version <= 0)
      break;

    unsigned int display_density = this->DisplayDensity(ON_SubD::Empty);
    if (false == archive.ReadInt(&display_density))
      break;
    SetAdaptiveDisplayDensity(display_density);

    unsigned int loc_as_unsigned = static_cast<unsigned char>(this->MeshLocation());
    if (false == archive.ReadInt(&loc_as_unsigned))
      break;
    const ON_SubDComponentLocation loc = ON_SubDComponentLocationFromUnsigned(loc_as_unsigned);
    SetMeshLocation(loc);

    if (chunk_version >= 2)
    {
      bool bDisplayDensityIsAbsolute = false;
      if (false == archive.ReadBool(&bDisplayDensityIsAbsolute))
        break;
      if (bDisplayDensityIsAbsolute)
        this->SetAbsoluteDisplayDensity(display_density);

      if (chunk_version >= 3)
      {
        bool bComputeCurvature = false;
        if (false == archive.ReadBool(&bComputeCurvature))
          break;
        this->SetComputeCurvature(bComputeCurvature);
      }
    }

    rc = true;
    break;
  }
  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;
}